

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

void __thiscall rw::Frame::syncHierarchyLTM(Frame *this)

{
  Frame *this_local;
  
  if (((this->object).privateFlags & 4) != 0) {
    memcpy(&this->ltm,&this->matrix,0x40);
  }
  syncLTMRecurse(this->child,(this->object).privateFlags);
  (this->object).privateFlags = (this->object).privateFlags & 0xfa;
  return;
}

Assistant:

void
Frame::syncHierarchyLTM(void)
{
	// Sync root's LTM
	if(this->object.privateFlags & Frame::SUBTREESYNCLTM)
		this->ltm = this->matrix;
	// ...and children
	syncLTMRecurse(this->child, this->object.privateFlags);
	// all clean now
	this->object.privateFlags &= ~Frame::SYNCLTM;
}